

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

void __thiscall
cmFileAPI::BuildClientRequestCMakeFiles
          (cmFileAPI *this,ClientRequest *r,
          vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> *versions)

{
  bool bVar1;
  vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> *extraout_RDX;
  vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> *extraout_RDX_00;
  vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> *versions_00;
  string local_60;
  reference local_40;
  RequestVersion *v;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> *__range1;
  vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> *versions_local;
  ClientRequest *r_local;
  cmFileAPI *this_local;
  
  __end1 = std::vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>::begin
                     (versions);
  v = (RequestVersion *)
      std::vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>::end
                (versions);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmFileAPI::RequestVersion_*,_std::vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>_>
                                *)&v);
    versions_00 = extraout_RDX;
    if (!bVar1) {
LAB_00449878:
      if ((r->super_Object).Version == 0) {
        NoSupportedVersion_abi_cxx11_(&local_60,(cmFileAPI *)versions,versions_00);
        std::__cxx11::string::operator=((string *)&r->Error,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
      }
      return;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<const_cmFileAPI::RequestVersion_*,_std::vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>_>
               ::operator*(&__end1);
    if ((local_40->Major == 1) && (local_40->Minor == 0)) {
      (r->super_Object).Version = (ulong)local_40->Major;
      versions_00 = extraout_RDX_00;
      goto LAB_00449878;
    }
    __gnu_cxx::
    __normal_iterator<const_cmFileAPI::RequestVersion_*,_std::vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmFileAPI::BuildClientRequestCMakeFiles(
  ClientRequest& r, std::vector<RequestVersion> const& versions)
{
  // Select a known version from those requested.
  for (RequestVersion const& v : versions) {
    if ((v.Major == 1 && v.Minor <= CMakeFilesV1Minor)) {
      r.Version = v.Major;
      break;
    }
  }
  if (!r.Version) {
    r.Error = NoSupportedVersion(versions);
  }
}